

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O0

bool __thiscall BamTools::PropertyFilterValue::check(PropertyFilterValue *this,string *query)

{
  bool bVar1;
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar2;
  long lVar3;
  long lVar4;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *valueString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __type local_1;
  
  bVar1 = Variant::is_type<std::__cxx11::string>((Variant *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    __lhs = Variant::get<std::__cxx11::string>((Variant *)0x2154c7);
    switch((int)in_RDI->_M_string_length) {
    case 0:
      lVar4 = std::__cxx11::string::find(in_RSI,(ulong)__lhs);
      local_1 = lVar4 != -1;
      break;
    case 1:
      lVar4 = std::__cxx11::string::find(in_RSI,(ulong)__lhs);
      lVar2 = std::__cxx11::string::length();
      lVar3 = std::__cxx11::string::length();
      local_1 = lVar4 == lVar2 - lVar3;
      break;
    case 2:
      local_1 = std::operator==(__lhs,in_RDI);
      break;
    case 3:
      local_1 = std::operator>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      break;
    case 4:
      local_1 = std::operator>=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      break;
    case 5:
      local_1 = std::operator<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      break;
    case 6:
      local_1 = std::operator<=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      break;
    case 7:
      local_1 = std::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      break;
    case 8:
      lVar4 = std::__cxx11::string::find(in_RSI,(ulong)__lhs);
      local_1 = lVar4 == 0;
      break;
    default:
      bamtools_noop();
      local_1 = false;
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Cannot compare different types!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool PropertyFilterValue::check(const std::string& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // localize string version of our filter value
    const std::string& valueString = Value.get<std::string>();

    // string matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::CONTAINS):
            return (query.find(valueString) != std::string::npos);
        case (PropertyFilterValue::ENDS_WITH):
            return (query.find(valueString) == (query.length() - valueString.length()));
        case (PropertyFilterValue::EXACT):
            return (query == valueString);
        case (PropertyFilterValue::GREATER_THAN):
            return (query > valueString);
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= valueString);
        case (PropertyFilterValue::LESS_THAN):
            return (query < valueString);
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= valueString);
        case (PropertyFilterValue::NOT):
            return (query != valueString);
        case (PropertyFilterValue::STARTS_WITH):
            return (query.find(valueString) == 0);
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}